

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCommit.h
# Opt level: O2

string * __thiscall
NewCommit::FormatIndexFile
          (string *__return_storage_ptr__,NewCommit *this,string *fileString,string *commit)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string word;
  
  std::operator+(__return_storage_ptr__,"commit ",commit);
  for (uVar2 = 0; uVar2 < fileString->_M_string_length - 4; uVar2 = uVar2 + 1) {
    std::__cxx11::string::substr((ulong)&local_d0,(ulong)fileString);
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)fileString);
    std::operator+(&local_70,&local_d0,&local_b0);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)fileString);
    std::operator+(&word,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    bVar1 = std::operator==(&word,"add");
    if (bVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&word);
  }
  return __return_storage_ptr__;
}

Assistant:

string FormatIndexFile(string fileString, string commit) {
        string result = "commit " + commit;
        for (int i = 0; i < fileString.length() - 4; i++) {
            string word = fileString.substr(i, 1) + fileString.substr(i + 1, 1) + fileString.substr(i + 2, 1);
            if (word == "add") {
                result += "\n";
            }
            result += fileString[i];
        }

        return result;
    }